

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

bool __thiscall
xray_re::xr_file_system::copy_file(xr_file_system *this,char *src_path,char *tgt_path)

{
  bool bVar1;
  CPath to;
  CPath from;
  path local_60;
  path local_38;
  
  if ((this->m_flags & 1) == 0) {
    CPath::CPath((CPath *)&local_38,src_path);
    CPath::CPath((CPath *)&local_60,tgt_path);
    CPath::make_preferred_abi_cxx11_((CPath *)&local_38);
    CPath::make_preferred_abi_cxx11_((CPath *)&local_60);
    bVar1 = std::filesystem::copy_file(&local_38,&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    std::filesystem::__cxx11::path::~path(&local_38);
  }
  else {
    dbg("fs_ro: copying %s to %s",src_path,tgt_path);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool xr_file_system::copy_file(const char* src_path, const char* tgt_path) const
{
	if(read_only())
	{
		dbg("fs_ro: copying %s to %s", src_path, tgt_path);

		return true;
	}
	else
	{
		CPath from(src_path), to(tgt_path);

		from.make_preferred();
		to.make_preferred();

		return fs::copy_file(from, to);
	}
}